

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

PIPELINE_RESOURCE_FLAGS
Diligent::ShaderVariableFlagsToPipelineResourceFlags(SHADER_VARIABLE_FLAGS Flags)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  string msg;
  string local_28;
  
  if ((Flags < (SHADER_VARIABLE_FLAG_LAST|SHADER_VARIABLE_FLAG_NO_DYNAMIC_BUFFERS)) &&
     ((0x117U >> (Flags & 0x1f) & 1) != 0)) {
    PVar1 = (&DAT_00367588)[Flags];
  }
  else {
    FormatString<char[32]>(&local_28,(char (*) [32])"Unexpected shader variable flag");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ShaderVariableFlagsToPipelineResourceFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x743);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    PVar1 = PIPELINE_RESOURCE_FLAG_NONE;
  }
  return PVar1;
}

Assistant:

PIPELINE_RESOURCE_FLAGS ShaderVariableFlagsToPipelineResourceFlags(SHADER_VARIABLE_FLAGS Flags)
{
    static_assert(SHADER_VARIABLE_FLAG_LAST == (1 << 3), "Please update the switch below to handle the new shader variable flags");
    switch (Flags)
    {
        case SHADER_VARIABLE_FLAG_NONE:
            return PIPELINE_RESOURCE_FLAG_NONE;

        case SHADER_VARIABLE_FLAG_NO_DYNAMIC_BUFFERS:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS;

        case SHADER_VARIABLE_FLAG_GENERAL_INPUT_ATTACHMENT_VK:
            return PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT;

        case SHADER_VARIABLE_FLAG_UNFILTERABLE_FLOAT_TEXTURE_WEBGPU:
        case SHADER_VARIABLE_FLAG_NON_FILTERING_SAMPLER_WEBGPU:
            return PIPELINE_RESOURCE_FLAG_NONE;

        default:
            UNEXPECTED("Unexpected shader variable flag");
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}